

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_filter_8_0_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  uint uVar221;
  int iVar222;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  uint in_stack_00000008;
  v128 res_128;
  v256 tap [8];
  int *sec_taps;
  int *pri_taps;
  int s2o2;
  int s2o1;
  int s1o2;
  int s1o1;
  int po2;
  int po1;
  v256 min;
  v256 max;
  v256 cdef_large_value_mask;
  v256 res;
  v256 row;
  v256 p3;
  v256 p2;
  v256 p1;
  v256 p0;
  v256 sum;
  int i;
  int clipping_required;
  uint16_t *dst16;
  uint8_t *dst8;
  v128 res_128_1;
  v256 tap_2 [8];
  v256 tap_1 [4];
  int i_1;
  int *sec_taps_1;
  int *pri_taps_1;
  int s2o2_1;
  int s2o1_1;
  int s1o2_1;
  int s1o1_1;
  int po2_1;
  int po1_1;
  v256 cdef_large_value_mask_1;
  v256 min_1;
  v256 max_1;
  v256 res_1;
  v256 row_1;
  v256 sum_1;
  v256 p3_1;
  v256 p2_1;
  v256 p1_1;
  v256 p0_1;
  int clipping_required_1;
  uint16_t *dst16_1;
  uint8_t *dst8_1;
  v256 s_15;
  v256 sign_15;
  v256 diff_15;
  v256 s_14;
  v256 sign_14;
  v256 diff_14;
  v256 s_13;
  v256 sign_13;
  v256 diff_13;
  v256 s_12;
  v256 sign_12;
  v256 diff_12;
  v256 s_23;
  v256 sign_23;
  v256 diff_23;
  v256 s_22;
  v256 sign_22;
  v256 diff_22;
  v256 s_21;
  v256 sign_21;
  v256 diff_21;
  v256 s_20;
  v256 sign_20;
  v256 diff_20;
  v256 s_19;
  v256 sign_19;
  v256 diff_19;
  v256 s_18;
  v256 sign_18;
  v256 diff_18;
  v256 s_17;
  v256 sign_17;
  v256 diff_17;
  v256 s_16;
  v256 sign_16;
  v256 diff_16;
  v256 s_3;
  v256 sign_3;
  v256 diff_3;
  v256 s_2;
  v256 sign_2;
  v256 diff_2;
  v256 s_1;
  v256 sign_1;
  v256 diff_1;
  v256 s;
  v256 sign;
  v256 diff;
  v256 s_11;
  v256 sign_11;
  v256 diff_11;
  v256 s_10;
  v256 sign_10;
  v256 diff_10;
  v256 s_9;
  v256 sign_9;
  v256 diff_9;
  v256 s_8;
  v256 sign_8;
  v256 diff_8;
  v256 s_7;
  v256 sign_7;
  v256 diff_7;
  v256 s_6;
  v256 sign_6;
  v256 diff_6;
  v256 s_5;
  v256 sign_5;
  v256 diff_5;
  v256 s_4;
  v256 sign_4;
  v256 diff_4;
  v256 max_u8_2;
  v256 max_u8;
  v256 max_u8_3;
  v256 max_u8_1;
  uint local_e2ac;
  uint local_e2a0;
  uint local_e26c;
  uint local_e260;
  undefined8 uStack_e090;
  undefined8 uStack_e088;
  undefined8 uStack_e050;
  undefined8 uStack_e048;
  int local_df90;
  uint local_df64;
  uint local_df60;
  int local_dccc;
  undefined8 uStack_dc90;
  undefined8 uStack_dc88;
  undefined8 uStack_dc10;
  undefined8 uStack_dc08;
  uint local_db24;
  uint local_db20;
  undefined8 local_d970;
  undefined8 uStack_d968;
  undefined8 local_d940;
  undefined8 uStack_d938;
  undefined8 local_d910;
  undefined8 uStack_d908;
  undefined8 local_d8e0;
  undefined8 uStack_d8d8;
  undefined8 local_d8b0;
  undefined8 uStack_d8a8;
  undefined8 local_d880;
  undefined8 uStack_d878;
  undefined8 local_d850;
  undefined8 uStack_d848;
  undefined8 local_d820;
  undefined8 uStack_d818;
  undefined8 local_d7f0;
  undefined8 uStack_d7e8;
  undefined8 local_d7c0;
  undefined8 uStack_d7b8;
  undefined8 local_d790;
  undefined8 uStack_d788;
  undefined8 local_d760;
  undefined8 uStack_d758;
  ulong local_d6e0;
  ulong uStack_d6d8;
  ulong uStack_d6d0;
  ulong uStack_d6c8;
  ulong local_d600;
  ulong uStack_d5f8;
  ulong uStack_d5f0;
  ulong uStack_d5e8;
  ulong local_d520;
  ulong uStack_d518;
  ulong uStack_d510;
  ulong uStack_d508;
  ulong local_d440;
  ulong uStack_d438;
  ulong uStack_d430;
  ulong uStack_d428;
  ulong local_d360;
  ulong uStack_d358;
  ulong uStack_d350;
  ulong uStack_d348;
  ulong local_d280;
  ulong uStack_d278;
  ulong uStack_d270;
  ulong uStack_d268;
  ulong local_d1a0;
  ulong uStack_d198;
  ulong uStack_d190;
  ulong uStack_d188;
  ulong local_d0c0;
  ulong uStack_d0b8;
  ulong uStack_d0b0;
  ulong uStack_d0a8;
  ulong local_cfe0;
  ulong uStack_cfd8;
  ulong uStack_cfd0;
  ulong uStack_cfc8;
  ulong local_cf00;
  ulong uStack_cef8;
  ulong uStack_cef0;
  ulong uStack_cee8;
  ulong local_ce20;
  ulong uStack_ce18;
  ulong uStack_ce10;
  ulong uStack_ce08;
  ulong local_cd40;
  ulong uStack_cd38;
  ulong uStack_cd30;
  ulong uStack_cd28;
  ulong local_cc60;
  ulong uStack_cc58;
  ulong uStack_cc50;
  ulong uStack_cc48;
  ulong local_cb80;
  ulong uStack_cb78;
  ulong uStack_cb70;
  ulong uStack_cb68;
  ulong local_caa0;
  ulong uStack_ca98;
  ulong uStack_ca90;
  ulong uStack_ca88;
  ulong local_c9c0;
  ulong uStack_c9b8;
  ulong uStack_c9b0;
  ulong uStack_c9a8;
  ushort local_c964;
  ulong local_c8e0;
  ulong uStack_c8d8;
  ulong uStack_c8d0;
  ulong uStack_c8c8;
  ulong local_c800;
  ulong uStack_c7f8;
  ulong uStack_c7f0;
  ulong uStack_c7e8;
  ulong local_c720;
  ulong uStack_c718;
  ulong uStack_c710;
  ulong uStack_c708;
  ulong local_c640;
  ulong uStack_c638;
  ulong uStack_c630;
  ulong uStack_c628;
  ulong local_c560;
  ulong uStack_c558;
  ulong uStack_c550;
  ulong uStack_c548;
  ulong local_c480;
  ulong uStack_c478;
  ulong uStack_c470;
  ulong uStack_c468;
  ulong local_c3a0;
  ulong uStack_c398;
  ulong uStack_c390;
  ulong uStack_c388;
  ulong local_c2c0;
  ulong uStack_c2b8;
  ulong uStack_c2b0;
  ulong uStack_c2a8;
  ushort local_c264;
  undefined8 local_92c0;
  undefined8 local_9280;
  ulong uStack_9078;
  ulong uStack_9038;
  ulong local_74c0;
  ulong uStack_74b8;
  ulong uStack_74b0;
  ulong uStack_74a8;
  ulong local_7480;
  ulong uStack_7478;
  ulong uStack_7470;
  ulong uStack_7468;
  ulong local_7440;
  ulong uStack_7438;
  ulong uStack_7430;
  ulong uStack_7428;
  ulong local_7400;
  ulong uStack_73f8;
  ulong uStack_73f0;
  ulong uStack_73e8;
  ulong local_73c0;
  ulong uStack_73b8;
  ulong uStack_73b0;
  ulong uStack_73a8;
  ulong local_7380;
  ulong uStack_7378;
  ulong uStack_7370;
  ulong uStack_7368;
  ulong local_7340;
  ulong uStack_7338;
  ulong uStack_7330;
  ulong uStack_7328;
  ulong local_7300;
  ulong uStack_72f8;
  ulong uStack_72f0;
  ulong uStack_72e8;
  ulong local_72c0;
  ulong uStack_72b8;
  ulong uStack_72b0;
  ulong uStack_72a8;
  ulong local_7280;
  ulong uStack_7278;
  ulong uStack_7270;
  ulong uStack_7268;
  ulong local_7240;
  ulong uStack_7238;
  ulong uStack_7230;
  ulong uStack_7228;
  ulong local_7200;
  ulong uStack_71f8;
  ulong uStack_71f0;
  ulong uStack_71e8;
  ulong local_71c0;
  ulong uStack_71b8;
  ulong uStack_71b0;
  ulong uStack_71a8;
  ulong local_7180;
  ulong uStack_7178;
  ulong uStack_7170;
  ulong uStack_7168;
  ulong local_7140;
  ulong uStack_7138;
  ulong uStack_7130;
  ulong uStack_7128;
  ulong local_7100;
  ulong uStack_70f8;
  ulong uStack_70f0;
  ulong uStack_70e8;
  ulong local_70c0;
  ulong uStack_70b8;
  ulong uStack_70b0;
  ulong uStack_70a8;
  ulong local_7080;
  ulong uStack_7078;
  ulong uStack_7070;
  ulong uStack_7068;
  ulong local_7040;
  ulong uStack_7038;
  ulong uStack_7030;
  ulong uStack_7028;
  ulong local_7000;
  ulong uStack_6ff8;
  ulong uStack_6ff0;
  ulong uStack_6fe8;
  ulong local_6fc0;
  ulong uStack_6fb8;
  ulong uStack_6fb0;
  ulong uStack_6fa8;
  ulong local_6f80;
  ulong uStack_6f78;
  ulong uStack_6f70;
  ulong uStack_6f68;
  ulong local_6f40;
  ulong uStack_6f38;
  ulong uStack_6f30;
  ulong uStack_6f28;
  ulong local_6f00;
  ulong uStack_6ef8;
  ulong uStack_6ef0;
  ulong uStack_6ee8;
  ulong uStack_1d48;
  ulong uStack_1d18;
  undefined8 local_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 local_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 local_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 local_1a10;
  undefined8 uStack_1a08;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 local_1850;
  undefined8 uStack_1848;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined4 local_1070;
  undefined4 local_1040;
  undefined4 local_1010;
  undefined4 local_fe0;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_c964 = (ushort)in_ECX;
  local_c264 = (ushort)in_R8D;
  if (coeff_shift == 8) {
    local_df60 = in_stack_00000008;
    local_df64 = pri_damping;
    auVar226 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,2);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,3);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,4);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,5);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,6);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,7);
    auVar223 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,2);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,3);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,4);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,5);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,6);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,7);
    auVar223 = ZEXT116(0) * auVar226 + ZEXT116(1) * auVar223;
    auVar226 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar226;
    iVar2 = cdef_directions_padded[(long)in_R9D + 2][0];
    iVar3 = cdef_directions_padded[(long)in_R9D + 2][1];
    iVar4 = cdef_directions_padded[(long)(in_R9D + 2) + 2][0];
    iVar5 = cdef_directions_padded[(long)(in_R9D + 2) + 2][1];
    iVar6 = cdef_directions_padded[(long)(in_R9D + -2) + 2][0];
    iVar7 = cdef_directions_padded[(long)(in_R9D + -2) + 2][1];
    uVar221 = (int)in_ECX >> ((byte)sec_damping & 0x1f) & 1;
    if (in_ECX != 0) {
      iVar222 = get_msb(in_ECX);
      if ((int)(in_stack_00000008 - iVar222) < 0) {
        local_e260 = 0;
      }
      else {
        iVar222 = get_msb(in_ECX);
        local_e260 = in_stack_00000008 - iVar222;
      }
      local_df60 = local_e260;
    }
    if (in_R8D != 0) {
      iVar222 = get_msb(in_R8D);
      if (pri_damping - iVar222 < 0) {
        local_e26c = 0;
      }
      else {
        iVar222 = get_msb(in_R8D);
        local_e26c = pri_damping - iVar222;
      }
      local_df64 = local_e26c;
    }
    uStack_e088 = auVar226._8_8_;
    uStack_e090 = auVar226._0_8_;
    for (local_df90 = 0; local_df90 < block_width; local_df90 = local_df90 + 2) {
      auVar226 = *(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90) * 2);
      auVar224 = ZEXT116(0) * auVar226 +
                 ZEXT116(1) * *(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + 0x90) * 2);
      auVar226 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar226;
      uStack_e050 = auVar226._0_8_;
      uStack_e048 = auVar226._8_8_;
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar2) * 2));
      auVar8 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar2) * 2));
      local_d8e0 = auVar226._0_8_;
      uStack_d8d8 = auVar226._8_8_;
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar2) * 2));
      auVar229 = vlddqu_avx(*(undefined1 (*) [16])
                             (in_RDX + (long)((local_df90 * 0x90 - iVar2) + 0x90) * 2));
      local_d910 = auVar226._0_8_;
      uStack_d908 = auVar226._8_8_;
      auVar38._16_8_ = local_d8e0;
      auVar38._0_16_ = auVar8;
      auVar38._24_8_ = uStack_d8d8;
      auVar37._16_8_ = uStack_e050;
      auVar37._0_16_ = auVar224;
      auVar37._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar38,auVar37);
      auVar16 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,7);
      auVar12 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,2);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,3);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,4);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,5);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,6);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,7);
      uStack_730 = auVar12._0_8_;
      uStack_728 = auVar12._8_8_;
      auVar17 = vpsrlw_avx2(auVar20,ZEXT416(local_df60));
      auVar78._16_8_ = uStack_730;
      auVar78._0_16_ = auVar226;
      auVar78._24_8_ = uStack_728;
      auVar17 = vpsubusw_avx2(auVar78,auVar17);
      local_c9c0 = auVar16._0_8_;
      uStack_c9b8 = auVar16._8_8_;
      uStack_c9b0 = auVar16._16_8_;
      uStack_c9a8 = auVar16._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar17);
      auVar20 = vpaddw_avx2(auVar16,auVar20);
      local_72c0 = auVar20._0_8_;
      uStack_72b8 = auVar20._8_8_;
      uStack_72b0 = auVar20._16_8_;
      uStack_72a8 = auVar20._24_8_;
      auVar40._16_8_ = local_d910;
      auVar40._0_16_ = auVar229;
      auVar40._24_8_ = uStack_d908;
      auVar39._16_8_ = uStack_e050;
      auVar39._0_16_ = auVar224;
      auVar39._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar40,auVar39);
      auVar16 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,7);
      auVar12 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,2);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,3);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,4);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,5);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,6);
      auVar12 = vpinsrw_avx(auVar12,in_ECX & 0xffff,7);
      uStack_6f0 = auVar12._0_8_;
      uStack_6e8 = auVar12._8_8_;
      auVar17 = vpsrlw_avx2(auVar20,ZEXT416(local_df60));
      auVar77._16_8_ = uStack_6f0;
      auVar77._0_16_ = auVar226;
      auVar77._24_8_ = uStack_6e8;
      auVar17 = vpsubusw_avx2(auVar77,auVar17);
      local_caa0 = auVar16._0_8_;
      uStack_ca98 = auVar16._8_8_;
      uStack_ca90 = auVar16._16_8_;
      uStack_ca88 = auVar16._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar17);
      auVar20 = vpaddw_avx2(auVar16,auVar20);
      local_7280 = auVar20._0_8_;
      uStack_7278 = auVar20._8_8_;
      uStack_7270 = auVar20._16_8_;
      uStack_7268 = auVar20._24_8_;
      uVar1 = (ushort)cdef_pri_taps[(int)uVar221][0];
      auVar226 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,2);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,3);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,4);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,5);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,6);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,7);
      auVar12 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar12 = vpinsrw_avx(auVar12,(uint)uVar1,2);
      auVar12 = vpinsrw_avx(auVar12,(uint)uVar1,3);
      auVar12 = vpinsrw_avx(auVar12,(uint)uVar1,4);
      auVar12 = vpinsrw_avx(auVar12,(uint)uVar1,5);
      auVar12 = vpinsrw_avx(auVar12,(uint)uVar1,6);
      auVar12 = vpinsrw_avx(auVar12,(uint)uVar1,7);
      uStack_230 = auVar12._0_8_;
      uStack_228 = auVar12._8_8_;
      auVar98._8_8_ = uStack_72b8 ^ uStack_c9b8;
      auVar98._0_8_ = local_72c0 ^ local_c9c0;
      auVar98._16_8_ = uStack_72b0 ^ uStack_c9b0;
      auVar98._24_8_ = uStack_72a8 ^ uStack_c9a8;
      auVar97._8_8_ = uStack_7278 ^ uStack_ca98;
      auVar97._0_8_ = local_7280 ^ local_caa0;
      auVar97._16_8_ = uStack_7270 ^ uStack_ca90;
      auVar97._24_8_ = uStack_7268 ^ uStack_ca88;
      auVar20 = vpaddw_avx2(auVar98,auVar97);
      auVar117._16_8_ = uStack_230;
      auVar117._0_16_ = auVar226;
      auVar117._24_8_ = uStack_228;
      auVar20 = vpmullw_avx2(auVar117,auVar20);
      auVar16 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar20);
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar3) * 2));
      auVar12 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar3) * 2));
      local_d940 = auVar226._0_8_;
      uStack_d938 = auVar226._8_8_;
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar3) * 2));
      auVar9 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)((local_df90 * 0x90 - iVar3) + 0x90) * 2));
      local_d970 = auVar226._0_8_;
      uStack_d968 = auVar226._8_8_;
      auVar42._16_8_ = local_d940;
      auVar42._0_16_ = auVar12;
      auVar42._24_8_ = uStack_d938;
      auVar41._16_8_ = uStack_e050;
      auVar41._0_16_ = auVar224;
      auVar41._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar42,auVar41);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,7);
      auVar13 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,2);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,3);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,4);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,5);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,6);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,7);
      uStack_6b0 = auVar13._0_8_;
      uStack_6a8 = auVar13._8_8_;
      auVar18 = vpsrlw_avx2(auVar20,ZEXT416(local_df60));
      auVar76._16_8_ = uStack_6b0;
      auVar76._0_16_ = auVar226;
      auVar76._24_8_ = uStack_6a8;
      auVar18 = vpsubusw_avx2(auVar76,auVar18);
      local_cb80 = auVar17._0_8_;
      uStack_cb78 = auVar17._8_8_;
      uStack_cb70 = auVar17._16_8_;
      uStack_cb68 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar18);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7240 = auVar20._0_8_;
      uStack_7238 = auVar20._8_8_;
      uStack_7230 = auVar20._16_8_;
      uStack_7228 = auVar20._24_8_;
      auVar44._16_8_ = local_d970;
      auVar44._0_16_ = auVar9;
      auVar44._24_8_ = uStack_d968;
      auVar43._16_8_ = uStack_e050;
      auVar43._0_16_ = auVar224;
      auVar43._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar44,auVar43);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,7);
      auVar13 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,2);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,3);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,4);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,5);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,6);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,7);
      uStack_670 = auVar13._0_8_;
      uStack_668 = auVar13._8_8_;
      auVar18 = vpsrlw_avx2(auVar20,ZEXT416(local_df60));
      auVar75._16_8_ = uStack_670;
      auVar75._0_16_ = auVar226;
      auVar75._24_8_ = uStack_668;
      auVar18 = vpsubusw_avx2(auVar75,auVar18);
      local_cc60 = auVar17._0_8_;
      uStack_cc58 = auVar17._8_8_;
      uStack_cc50 = auVar17._16_8_;
      uStack_cc48 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar18);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7200 = auVar20._0_8_;
      uStack_71f8 = auVar20._8_8_;
      uStack_71f0 = auVar20._16_8_;
      uStack_71e8 = auVar20._24_8_;
      uVar1 = (ushort)cdef_pri_taps[(int)uVar221][1];
      auVar226 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,2);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,3);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,4);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,5);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,6);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,7);
      auVar13 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar1,2);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar1,3);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar1,4);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar1,5);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar1,6);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar1,7);
      auVar227 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar226;
      uStack_1f0 = auVar227._0_8_;
      uStack_1e8 = auVar227._8_8_;
      auVar100._8_8_ = uStack_7238 ^ uStack_cb78;
      auVar100._0_8_ = local_7240 ^ local_cb80;
      auVar100._16_8_ = uStack_7230 ^ uStack_cb70;
      auVar100._24_8_ = uStack_7228 ^ uStack_cb68;
      auVar99._8_8_ = uStack_71f8 ^ uStack_cc58;
      auVar99._0_8_ = local_7200 ^ local_cc60;
      auVar99._16_8_ = uStack_71f0 ^ uStack_cc50;
      auVar99._24_8_ = uStack_71e8 ^ uStack_cc48;
      auVar20 = vpaddw_avx2(auVar100,auVar99);
      auVar118._16_8_ = uStack_1f0;
      auVar118._0_16_ = ZEXT116(0) * auVar226 + ZEXT116(1) * auVar13;
      auVar118._24_8_ = uStack_1e8;
      auVar20 = vpmullw_avx2(auVar118,auVar20);
      auVar16 = vpaddw_avx2(auVar16,auVar20);
      auVar195._16_8_ = local_d8e0;
      auVar195._0_16_ = auVar8;
      auVar195._24_8_ = uStack_d8d8;
      auVar197._16_8_ = local_d910;
      auVar197._0_16_ = auVar229;
      auVar197._24_8_ = uStack_d908;
      auVar20 = vpmaxub_avx2(auVar195,auVar197);
      auVar199._16_8_ = local_d940;
      auVar199._0_16_ = auVar12;
      auVar199._24_8_ = uStack_d938;
      auVar20 = vpmaxub_avx2(auVar20,auVar199);
      auVar201._16_8_ = local_d970;
      auVar201._0_16_ = auVar9;
      auVar201._24_8_ = uStack_d968;
      auVar20 = vpmaxub_avx2(auVar20,auVar201);
      auVar124._16_8_ = uStack_e090;
      auVar124._0_16_ = auVar223;
      auVar124._24_8_ = uStack_e088;
      auVar20 = vpand_avx2(auVar20,auVar124);
      auVar154._16_8_ = uStack_e050;
      auVar154._0_16_ = auVar224;
      auVar154._24_8_ = uStack_e048;
      auVar18 = vpmaxsw_avx2(auVar154,auVar20);
      auVar136._16_8_ = uStack_e050;
      auVar136._0_16_ = auVar224;
      auVar136._24_8_ = uStack_e048;
      auVar135._16_8_ = local_d8e0;
      auVar135._0_16_ = auVar8;
      auVar135._24_8_ = uStack_d8d8;
      auVar20 = vpminsw_avx2(auVar136,auVar135);
      auVar137._16_8_ = local_d910;
      auVar137._0_16_ = auVar229;
      auVar137._24_8_ = uStack_d908;
      auVar20 = vpminsw_avx2(auVar20,auVar137);
      auVar138._16_8_ = local_d940;
      auVar138._0_16_ = auVar12;
      auVar138._24_8_ = uStack_d938;
      auVar20 = vpminsw_avx2(auVar20,auVar138);
      auVar139._16_8_ = local_d970;
      auVar139._0_16_ = auVar9;
      auVar139._24_8_ = uStack_d968;
      auVar15 = vpminsw_avx2(auVar20,auVar139);
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar4) * 2));
      auVar8 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar4) * 2));
      local_d760 = auVar226._0_8_;
      uStack_d758 = auVar226._8_8_;
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar4) * 2));
      auVar229 = vlddqu_avx(*(undefined1 (*) [16])
                             (in_RDX + (long)((local_df90 * 0x90 - iVar4) + 0x90) * 2));
      local_d790 = auVar226._0_8_;
      uStack_d788 = auVar226._8_8_;
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar6) * 2));
      auVar12 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar6) * 2));
      local_d7c0 = auVar226._0_8_;
      uStack_d7b8 = auVar226._8_8_;
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar6) * 2));
      auVar9 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)((local_df90 * 0x90 - iVar6) + 0x90) * 2));
      local_d7f0 = auVar226._0_8_;
      uStack_d7e8 = auVar226._8_8_;
      auVar22._16_8_ = local_d760;
      auVar22._0_16_ = auVar8;
      auVar22._24_8_ = uStack_d758;
      auVar21._16_8_ = uStack_e050;
      auVar21._0_16_ = auVar224;
      auVar21._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar22,auVar21);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar13 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,2);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,3);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,4);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,5);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,6);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,7);
      uStack_930 = auVar13._0_8_;
      uStack_928 = auVar13._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_df64));
      auVar86._16_8_ = uStack_930;
      auVar86._0_16_ = auVar226;
      auVar86._24_8_ = uStack_928;
      auVar19 = vpsubusw_avx2(auVar86,auVar19);
      local_c2c0 = auVar17._0_8_;
      uStack_c2b8 = auVar17._8_8_;
      uStack_c2b0 = auVar17._16_8_;
      uStack_c2a8 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_74c0 = auVar20._0_8_;
      uStack_74b8 = auVar20._8_8_;
      uStack_74b0 = auVar20._16_8_;
      uStack_74a8 = auVar20._24_8_;
      auVar24._16_8_ = local_d790;
      auVar24._0_16_ = auVar229;
      auVar24._24_8_ = uStack_d788;
      auVar23._16_8_ = uStack_e050;
      auVar23._0_16_ = auVar224;
      auVar23._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar24,auVar23);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar13 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,2);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,3);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,4);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,5);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,6);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,7);
      uStack_8f0 = auVar13._0_8_;
      uStack_8e8 = auVar13._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_df64));
      auVar85._16_8_ = uStack_8f0;
      auVar85._0_16_ = auVar226;
      auVar85._24_8_ = uStack_8e8;
      auVar19 = vpsubusw_avx2(auVar85,auVar19);
      local_c3a0 = auVar17._0_8_;
      uStack_c398 = auVar17._8_8_;
      uStack_c390 = auVar17._16_8_;
      uStack_c388 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7480 = auVar20._0_8_;
      uStack_7478 = auVar20._8_8_;
      uStack_7470 = auVar20._16_8_;
      uStack_7468 = auVar20._24_8_;
      auVar26._16_8_ = local_d7c0;
      auVar26._0_16_ = auVar12;
      auVar26._24_8_ = uStack_d7b8;
      auVar25._16_8_ = uStack_e050;
      auVar25._0_16_ = auVar224;
      auVar25._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar26,auVar25);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar13 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,2);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,3);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,4);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,5);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,6);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,7);
      uStack_8b0 = auVar13._0_8_;
      uStack_8a8 = auVar13._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_df64));
      auVar84._16_8_ = uStack_8b0;
      auVar84._0_16_ = auVar226;
      auVar84._24_8_ = uStack_8a8;
      auVar19 = vpsubusw_avx2(auVar84,auVar19);
      local_c480 = auVar17._0_8_;
      uStack_c478 = auVar17._8_8_;
      uStack_c470 = auVar17._16_8_;
      uStack_c468 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7440 = auVar20._0_8_;
      uStack_7438 = auVar20._8_8_;
      uStack_7430 = auVar20._16_8_;
      uStack_7428 = auVar20._24_8_;
      auVar28._16_8_ = local_d7f0;
      auVar28._0_16_ = auVar9;
      auVar28._24_8_ = uStack_d7e8;
      auVar27._16_8_ = uStack_e050;
      auVar27._0_16_ = auVar224;
      auVar27._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar28,auVar27);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar13 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,2);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,3);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,4);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,5);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,6);
      auVar13 = vpinsrw_avx(auVar13,in_R8D & 0xffff,7);
      uStack_870 = auVar13._0_8_;
      uStack_868 = auVar13._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_df64));
      auVar83._16_8_ = uStack_870;
      auVar83._0_16_ = auVar226;
      auVar83._24_8_ = uStack_868;
      auVar19 = vpsubusw_avx2(auVar83,auVar19);
      local_c560 = auVar17._0_8_;
      uStack_c558 = auVar17._8_8_;
      uStack_c550 = auVar17._16_8_;
      uStack_c548 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7400 = auVar20._0_8_;
      uStack_73f8 = auVar20._8_8_;
      uStack_73f0 = auVar20._16_8_;
      uStack_73e8 = auVar20._24_8_;
      auVar226 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar226 = vpinsrw_avx(auVar226,2,2);
      auVar226 = vpinsrw_avx(auVar226,2,3);
      auVar226 = vpinsrw_avx(auVar226,2,4);
      auVar226 = vpinsrw_avx(auVar226,2,5);
      auVar226 = vpinsrw_avx(auVar226,2,6);
      auVar226 = vpinsrw_avx(auVar226,2,7);
      auVar13 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar13 = vpinsrw_avx(auVar13,2,2);
      auVar13 = vpinsrw_avx(auVar13,2,3);
      auVar13 = vpinsrw_avx(auVar13,2,4);
      auVar13 = vpinsrw_avx(auVar13,2,5);
      auVar13 = vpinsrw_avx(auVar13,2,6);
      auVar13 = vpinsrw_avx(auVar13,2,7);
      uStack_2b0 = auVar13._0_8_;
      uStack_2a8 = auVar13._8_8_;
      auVar90._8_8_ = uStack_74b8 ^ uStack_c2b8;
      auVar90._0_8_ = local_74c0 ^ local_c2c0;
      auVar90._16_8_ = uStack_74b0 ^ uStack_c2b0;
      auVar90._24_8_ = uStack_74a8 ^ uStack_c2a8;
      auVar89._8_8_ = uStack_7478 ^ uStack_c398;
      auVar89._0_8_ = local_7480 ^ local_c3a0;
      auVar89._16_8_ = uStack_7470 ^ uStack_c390;
      auVar89._24_8_ = uStack_7468 ^ uStack_c388;
      auVar20 = vpaddw_avx2(auVar90,auVar89);
      auVar92._8_8_ = uStack_7438 ^ uStack_c478;
      auVar92._0_8_ = local_7440 ^ local_c480;
      auVar92._16_8_ = uStack_7430 ^ uStack_c470;
      auVar92._24_8_ = uStack_7428 ^ uStack_c468;
      auVar91._8_8_ = uStack_73f8 ^ uStack_c558;
      auVar91._0_8_ = local_7400 ^ local_c560;
      auVar91._16_8_ = uStack_73f0 ^ uStack_c550;
      auVar91._24_8_ = uStack_73e8 ^ uStack_c548;
      auVar17 = vpaddw_avx2(auVar92,auVar91);
      auVar20 = vpaddw_avx2(auVar20,auVar17);
      auVar115._16_8_ = uStack_2b0;
      auVar115._0_16_ = auVar226;
      auVar115._24_8_ = uStack_2a8;
      auVar20 = vpmullw_avx2(auVar115,auVar20);
      auVar16 = vpaddw_avx2(auVar16,auVar20);
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar5) * 2));
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar5) * 2));
      local_d820 = auVar226._0_8_;
      uStack_d818 = auVar226._8_8_;
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar5) * 2));
      auVar227 = vlddqu_avx(*(undefined1 (*) [16])
                             (in_RDX + (long)((local_df90 * 0x90 - iVar5) + 0x90) * 2));
      local_d850 = auVar226._0_8_;
      uStack_d848 = auVar226._8_8_;
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar7) * 2));
      auVar10 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar7) * 2));
      local_d880 = auVar226._0_8_;
      uStack_d878 = auVar226._8_8_;
      auVar226 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar7) * 2));
      auVar11 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)((local_df90 * 0x90 - iVar7) + 0x90) * 2));
      local_d8b0 = auVar226._0_8_;
      uStack_d8a8 = auVar226._8_8_;
      auVar30._16_8_ = local_d820;
      auVar30._0_16_ = auVar13;
      auVar30._24_8_ = uStack_d818;
      auVar29._16_8_ = uStack_e050;
      auVar29._0_16_ = auVar224;
      auVar29._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar30,auVar29);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,2);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,3);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,4);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,5);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,7);
      uStack_830 = auVar14._0_8_;
      uStack_828 = auVar14._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_df64));
      auVar82._16_8_ = uStack_830;
      auVar82._0_16_ = auVar226;
      auVar82._24_8_ = uStack_828;
      auVar19 = vpsubusw_avx2(auVar82,auVar19);
      local_c640 = auVar17._0_8_;
      uStack_c638 = auVar17._8_8_;
      uStack_c630 = auVar17._16_8_;
      uStack_c628 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_73c0 = auVar20._0_8_;
      uStack_73b8 = auVar20._8_8_;
      uStack_73b0 = auVar20._16_8_;
      uStack_73a8 = auVar20._24_8_;
      auVar32._16_8_ = local_d850;
      auVar32._0_16_ = auVar227;
      auVar32._24_8_ = uStack_d848;
      auVar31._16_8_ = uStack_e050;
      auVar31._0_16_ = auVar224;
      auVar31._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar32,auVar31);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,2);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,3);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,4);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,5);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,7);
      uStack_7f0 = auVar14._0_8_;
      uStack_7e8 = auVar14._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_df64));
      auVar81._16_8_ = uStack_7f0;
      auVar81._0_16_ = auVar226;
      auVar81._24_8_ = uStack_7e8;
      auVar19 = vpsubusw_avx2(auVar81,auVar19);
      local_c720 = auVar17._0_8_;
      uStack_c718 = auVar17._8_8_;
      uStack_c710 = auVar17._16_8_;
      uStack_c708 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7380 = auVar20._0_8_;
      uStack_7378 = auVar20._8_8_;
      uStack_7370 = auVar20._16_8_;
      uStack_7368 = auVar20._24_8_;
      auVar34._16_8_ = local_d880;
      auVar34._0_16_ = auVar10;
      auVar34._24_8_ = uStack_d878;
      auVar33._16_8_ = uStack_e050;
      auVar33._0_16_ = auVar224;
      auVar33._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar34,auVar33);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,2);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,3);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,4);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,5);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,7);
      uStack_7b0 = auVar14._0_8_;
      uStack_7a8 = auVar14._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_df64));
      auVar80._16_8_ = uStack_7b0;
      auVar80._0_16_ = auVar226;
      auVar80._24_8_ = uStack_7a8;
      auVar19 = vpsubusw_avx2(auVar80,auVar19);
      local_c800 = auVar17._0_8_;
      uStack_c7f8 = auVar17._8_8_;
      uStack_c7f0 = auVar17._16_8_;
      uStack_c7e8 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7340 = auVar20._0_8_;
      uStack_7338 = auVar20._8_8_;
      uStack_7330 = auVar20._16_8_;
      uStack_7328 = auVar20._24_8_;
      auVar36._16_8_ = local_d8b0;
      auVar36._0_16_ = auVar11;
      auVar36._24_8_ = uStack_d8a8;
      auVar35._16_8_ = uStack_e050;
      auVar35._0_16_ = auVar224;
      auVar35._24_8_ = uStack_e048;
      auVar20 = vpsubw_avx2(auVar36,auVar35);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,2);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,3);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,4);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,5);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,7);
      uStack_770 = auVar14._0_8_;
      uStack_768 = auVar14._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_df64));
      auVar79._16_8_ = uStack_770;
      auVar79._0_16_ = auVar226;
      auVar79._24_8_ = uStack_768;
      auVar19 = vpsubusw_avx2(auVar79,auVar19);
      local_c8e0 = auVar17._0_8_;
      uStack_c8d8 = auVar17._8_8_;
      uStack_c8d0 = auVar17._16_8_;
      uStack_c8c8 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7300 = auVar20._0_8_;
      uStack_72f8 = auVar20._8_8_;
      uStack_72f0 = auVar20._16_8_;
      uStack_72e8 = auVar20._24_8_;
      auVar226 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar226 = vpinsrw_avx(auVar226,1,2);
      auVar226 = vpinsrw_avx(auVar226,1,3);
      auVar226 = vpinsrw_avx(auVar226,1,4);
      auVar226 = vpinsrw_avx(auVar226,1,5);
      auVar226 = vpinsrw_avx(auVar226,1,6);
      auVar226 = vpinsrw_avx(auVar226,1,7);
      auVar14 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar14 = vpinsrw_avx(auVar14,1,2);
      auVar14 = vpinsrw_avx(auVar14,1,3);
      auVar14 = vpinsrw_avx(auVar14,1,4);
      auVar14 = vpinsrw_avx(auVar14,1,5);
      auVar14 = vpinsrw_avx(auVar14,1,6);
      auVar14 = vpinsrw_avx(auVar14,1,7);
      auVar228 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar226;
      uStack_270 = auVar228._0_8_;
      uStack_268 = auVar228._8_8_;
      auVar94._8_8_ = uStack_73b8 ^ uStack_c638;
      auVar94._0_8_ = local_73c0 ^ local_c640;
      auVar94._16_8_ = uStack_73b0 ^ uStack_c630;
      auVar94._24_8_ = uStack_73a8 ^ uStack_c628;
      auVar93._8_8_ = uStack_7378 ^ uStack_c718;
      auVar93._0_8_ = local_7380 ^ local_c720;
      auVar93._16_8_ = uStack_7370 ^ uStack_c710;
      auVar93._24_8_ = uStack_7368 ^ uStack_c708;
      auVar20 = vpaddw_avx2(auVar94,auVar93);
      auVar96._8_8_ = uStack_7338 ^ uStack_c7f8;
      auVar96._0_8_ = local_7340 ^ local_c800;
      auVar96._16_8_ = uStack_7330 ^ uStack_c7f0;
      auVar96._24_8_ = uStack_7328 ^ uStack_c7e8;
      auVar95._8_8_ = uStack_72f8 ^ uStack_c8d8;
      auVar95._0_8_ = local_7300 ^ local_c8e0;
      auVar95._16_8_ = uStack_72f0 ^ uStack_c8d0;
      auVar95._24_8_ = uStack_72e8 ^ uStack_c8c8;
      auVar17 = vpaddw_avx2(auVar96,auVar95);
      auVar20 = vpaddw_avx2(auVar20,auVar17);
      auVar116._16_8_ = uStack_270;
      auVar116._0_16_ = ZEXT116(0) * auVar226 + ZEXT116(1) * auVar14;
      auVar116._24_8_ = uStack_268;
      auVar20 = vpmullw_avx2(auVar116,auVar20);
      auVar20 = vpaddw_avx2(auVar16,auVar20);
      auVar196._16_8_ = local_d760;
      auVar196._0_16_ = auVar8;
      auVar196._24_8_ = uStack_d758;
      auVar198._16_8_ = local_d790;
      auVar198._0_16_ = auVar229;
      auVar198._24_8_ = uStack_d788;
      auVar16 = vpmaxub_avx2(auVar196,auVar198);
      auVar200._16_8_ = local_d7c0;
      auVar200._0_16_ = auVar12;
      auVar200._24_8_ = uStack_d7b8;
      auVar16 = vpmaxub_avx2(auVar16,auVar200);
      auVar202._16_8_ = local_d7f0;
      auVar202._0_16_ = auVar9;
      auVar202._24_8_ = uStack_d7e8;
      auVar16 = vpmaxub_avx2(auVar16,auVar202);
      auVar203._16_8_ = local_d820;
      auVar203._0_16_ = auVar13;
      auVar203._24_8_ = uStack_d818;
      auVar16 = vpmaxub_avx2(auVar16,auVar203);
      auVar204._16_8_ = local_d850;
      auVar204._0_16_ = auVar227;
      auVar204._24_8_ = uStack_d848;
      auVar16 = vpmaxub_avx2(auVar16,auVar204);
      auVar205._16_8_ = local_d880;
      auVar205._0_16_ = auVar10;
      auVar205._24_8_ = uStack_d878;
      auVar16 = vpmaxub_avx2(auVar16,auVar205);
      auVar206._16_8_ = local_d8b0;
      auVar206._0_16_ = auVar11;
      auVar206._24_8_ = uStack_d8a8;
      auVar16 = vpmaxub_avx2(auVar16,auVar206);
      auVar126._16_8_ = uStack_e090;
      auVar126._0_16_ = auVar223;
      auVar126._24_8_ = uStack_e088;
      auVar16 = vpand_avx2(auVar16,auVar126);
      auVar17 = vpmaxsw_avx2(auVar18,auVar16);
      auVar127._16_8_ = local_d760;
      auVar127._0_16_ = auVar8;
      auVar127._24_8_ = uStack_d758;
      auVar16 = vpminsw_avx2(auVar15,auVar127);
      auVar128._16_8_ = local_d790;
      auVar128._0_16_ = auVar229;
      auVar128._24_8_ = uStack_d788;
      auVar16 = vpminsw_avx2(auVar16,auVar128);
      auVar129._16_8_ = local_d7c0;
      auVar129._0_16_ = auVar12;
      auVar129._24_8_ = uStack_d7b8;
      auVar16 = vpminsw_avx2(auVar16,auVar129);
      auVar130._16_8_ = local_d7f0;
      auVar130._0_16_ = auVar9;
      auVar130._24_8_ = uStack_d7e8;
      auVar16 = vpminsw_avx2(auVar16,auVar130);
      auVar131._16_8_ = local_d820;
      auVar131._0_16_ = auVar13;
      auVar131._24_8_ = uStack_d818;
      auVar16 = vpminsw_avx2(auVar16,auVar131);
      auVar132._16_8_ = local_d850;
      auVar132._0_16_ = auVar227;
      auVar132._24_8_ = uStack_d848;
      auVar16 = vpminsw_avx2(auVar16,auVar132);
      auVar133._16_8_ = local_d880;
      auVar133._0_16_ = auVar10;
      auVar133._24_8_ = uStack_d878;
      auVar16 = vpminsw_avx2(auVar16,auVar133);
      auVar134._16_8_ = local_d8b0;
      auVar134._0_16_ = auVar11;
      auVar134._24_8_ = uStack_d8a8;
      auVar18 = vpminsw_avx2(auVar16,auVar134);
      uStack_9078 = SUB328(ZEXT832(0),4);
      auVar16 = vpcmpgtw_avx2(ZEXT832(uStack_9078) << 0x40,auVar20);
      auVar20 = vpaddw_avx2(auVar20,auVar16);
      auVar226 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar226 = vpinsrw_avx(auVar226,8,2);
      auVar226 = vpinsrw_avx(auVar226,8,3);
      auVar226 = vpinsrw_avx(auVar226,8,4);
      auVar226 = vpinsrw_avx(auVar226,8,5);
      auVar226 = vpinsrw_avx(auVar226,8,6);
      auVar226 = vpinsrw_avx(auVar226,8,7);
      auVar8 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar8 = vpinsrw_avx(auVar8,8,2);
      auVar8 = vpinsrw_avx(auVar8,8,3);
      auVar8 = vpinsrw_avx(auVar8,8,4);
      auVar8 = vpinsrw_avx(auVar8,8,5);
      auVar8 = vpinsrw_avx(auVar8,8,6);
      auVar8 = vpinsrw_avx(auVar8,8,7);
      auVar229 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar226;
      uStack_2f0 = auVar229._0_8_;
      uStack_2e8 = auVar229._8_8_;
      auVar87._16_8_ = uStack_2f0;
      auVar87._0_16_ = ZEXT116(0) * auVar226 + ZEXT116(1) * auVar8;
      auVar87._24_8_ = uStack_2e8;
      auVar20 = vpaddw_avx2(auVar20,auVar87);
      auVar20 = vpsraw_avx2(auVar20,ZEXT416(4));
      auVar88._16_8_ = uStack_e050;
      auVar88._0_16_ = auVar224;
      auVar88._24_8_ = uStack_e048;
      auVar20 = vpaddw_avx2(auVar88,auVar20);
      auVar20 = vpmaxsw_avx2(auVar20,auVar18);
      auVar20 = vpminsw_avx2(auVar20,auVar17);
      auVar20 = vpackuswb_avx2(auVar20,auVar20);
      auVar20 = vpermq_avx2(auVar20,0xd8);
      auVar226 = vpsrldq_avx(auVar20._0_16_,8);
      local_9280 = auVar226._0_8_;
      *(undefined8 *)(in_RDI + local_df90 * in_ESI) = local_9280;
      uStack_1d48 = SUB168(ZEXT816(0),4);
      auVar219._8_8_ = 0;
      auVar219._0_8_ = uStack_1d48;
      auVar226 = vpunpcklqdq_avx(auVar20._0_16_,auVar219 << 0x40);
      local_92c0 = auVar226._0_8_;
      *(undefined8 *)(in_RDI + (local_df90 + 1) * in_ESI) = local_92c0;
    }
  }
  else {
    local_db20 = in_stack_00000008;
    local_db24 = pri_damping;
    auVar226 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,2);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,3);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,4);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,5);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,6);
    auVar226 = vpinsrw_avx(auVar226,0xbfff,7);
    auVar223 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,2);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,3);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,4);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,5);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,6);
    auVar223 = vpinsrw_avx(auVar223,0xbfff,7);
    auVar223 = ZEXT116(0) * auVar226 + ZEXT116(1) * auVar223;
    auVar226 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar226;
    iVar2 = cdef_directions_padded[(long)in_R9D + 2][0];
    iVar3 = cdef_directions_padded[(long)in_R9D + 2][1];
    iVar4 = cdef_directions_padded[(long)(in_R9D + 2) + 2][0];
    iVar5 = cdef_directions_padded[(long)(in_R9D + 2) + 2][1];
    iVar6 = cdef_directions_padded[(long)(in_R9D + -2) + 2][0];
    iVar7 = cdef_directions_padded[(long)(in_R9D + -2) + 2][1];
    uVar221 = (int)in_ECX >> ((byte)sec_damping & 0x1f) & 1;
    if (in_ECX != 0) {
      iVar222 = get_msb(in_ECX);
      if ((int)(in_stack_00000008 - iVar222) < 0) {
        local_e2a0 = 0;
      }
      else {
        iVar222 = get_msb(in_ECX);
        local_e2a0 = in_stack_00000008 - iVar222;
      }
      local_db20 = local_e2a0;
    }
    if (in_R8D != 0) {
      iVar222 = get_msb(in_R8D);
      if (pri_damping - iVar222 < 0) {
        local_e2ac = 0;
      }
      else {
        iVar222 = get_msb(in_R8D);
        local_e2ac = pri_damping - iVar222;
      }
      local_db24 = local_e2ac;
    }
    uStack_dc88 = auVar226._8_8_;
    uStack_dc90 = auVar226._0_8_;
    for (local_dccc = 0; local_dccc < block_width; local_dccc = local_dccc + 4) {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90) * 2);
      auVar226._8_8_ = 0;
      auVar226._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90) * 2);
      auVar226 = vpunpcklqdq_avx(auVar12,auVar226);
      auVar229._8_8_ = 0;
      auVar229._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0) * 2);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120) * 2);
      auVar8 = vpunpcklqdq_avx(auVar229,auVar8);
      auVar225 = ZEXT116(0) * auVar226 + ZEXT116(1) * auVar8;
      auVar226 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar226;
      uStack_dc10 = auVar226._0_8_;
      uStack_dc08 = auVar226._8_8_;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar2) * 2);
      auVar181._8_8_ = 0;
      auVar181._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar2) * 2);
      auVar226 = vpunpcklqdq_avx(auVar182,auVar181);
      auVar180._8_8_ = 0;
      auVar180._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar2) * 2);
      auVar179._8_8_ = 0;
      auVar179._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar2) * 2);
      auVar229 = vpunpcklqdq_avx(auVar180,auVar179);
      local_1b60 = auVar226._0_8_;
      uStack_1b58 = auVar226._8_8_;
      auVar18._16_8_ = local_1b60;
      auVar18._0_16_ = auVar229;
      auVar18._24_8_ = uStack_1b58;
      auVar16._16_8_ = uStack_dc10;
      auVar16._0_16_ = auVar225;
      auVar16._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar18,auVar16);
      auVar16 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,7);
      uStack_430 = auVar8._0_8_;
      uStack_428 = auVar8._8_8_;
      auVar17 = vpsrlw_avx2(auVar20,ZEXT416(local_db20));
      auVar66._16_8_ = uStack_430;
      auVar66._0_16_ = auVar226;
      auVar66._24_8_ = uStack_428;
      auVar17 = vpsubusw_avx2(auVar66,auVar17);
      local_d440 = auVar16._0_8_;
      uStack_d438 = auVar16._8_8_;
      uStack_d430 = auVar16._16_8_;
      uStack_d428 = auVar16._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar17);
      auVar20 = vpaddw_avx2(auVar16,auVar20);
      local_6fc0 = auVar20._0_8_;
      uStack_6fb8 = auVar20._8_8_;
      uStack_6fb0 = auVar20._16_8_;
      uStack_6fa8 = auVar20._24_8_;
      auVar186._8_8_ = 0;
      auVar186._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar2) + 0x90) * 2);
      auVar185._8_8_ = 0;
      auVar185._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar2) * 2);
      auVar226 = vpunpcklqdq_avx(auVar186,auVar185);
      auVar184._8_8_ = 0;
      auVar184._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar2) + 0x1b0) * 2);
      auVar183._8_8_ = 0;
      auVar183._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar2) + 0x120) * 2);
      auVar12 = vpunpcklqdq_avx(auVar184,auVar183);
      local_1bd0 = auVar226._0_8_;
      uStack_1bc8 = auVar226._8_8_;
      auVar58._16_8_ = local_1bd0;
      auVar58._0_16_ = auVar12;
      auVar58._24_8_ = uStack_1bc8;
      auVar15._16_8_ = uStack_dc10;
      auVar15._0_16_ = auVar225;
      auVar15._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar58,auVar15);
      auVar16 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,7);
      uStack_3f0 = auVar8._0_8_;
      uStack_3e8 = auVar8._8_8_;
      auVar17 = vpsrlw_avx2(auVar20,ZEXT416(local_db20));
      auVar65._16_8_ = uStack_3f0;
      auVar65._0_16_ = auVar226;
      auVar65._24_8_ = uStack_3e8;
      auVar17 = vpsubusw_avx2(auVar65,auVar17);
      local_d520 = auVar16._0_8_;
      uStack_d518 = auVar16._8_8_;
      uStack_d510 = auVar16._16_8_;
      uStack_d508 = auVar16._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar17);
      auVar20 = vpaddw_avx2(auVar16,auVar20);
      local_6f80 = auVar20._0_8_;
      uStack_6f78 = auVar20._8_8_;
      uStack_6f70 = auVar20._16_8_;
      uStack_6f68 = auVar20._24_8_;
      uVar1 = (ushort)cdef_pri_taps[(int)uVar221][0];
      auVar226 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,2);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,3);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,4);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,5);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,6);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,7);
      auVar8 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,2);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,3);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,4);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,5);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,6);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,7);
      uStack_b0 = auVar8._0_8_;
      uStack_a8 = auVar8._8_8_;
      auVar112._8_8_ = uStack_6fb8 ^ uStack_d438;
      auVar112._0_8_ = local_6fc0 ^ local_d440;
      auVar112._16_8_ = uStack_6fb0 ^ uStack_d430;
      auVar112._24_8_ = uStack_6fa8 ^ uStack_d428;
      auVar111._8_8_ = uStack_6f78 ^ uStack_d518;
      auVar111._0_8_ = local_6f80 ^ local_d520;
      auVar111._16_8_ = uStack_6f70 ^ uStack_d510;
      auVar111._24_8_ = uStack_6f68 ^ uStack_d508;
      auVar20 = vpaddw_avx2(auVar112,auVar111);
      auVar121._16_8_ = uStack_b0;
      auVar121._0_16_ = auVar226;
      auVar121._24_8_ = uStack_a8;
      auVar20 = vpmullw_avx2(auVar121,auVar20);
      auVar16 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar20);
      auVar190._8_8_ = 0;
      auVar190._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar3) * 2);
      auVar189._8_8_ = 0;
      auVar189._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar3) * 2);
      auVar226 = vpunpcklqdq_avx(auVar190,auVar189);
      auVar188._8_8_ = 0;
      auVar188._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar3) * 2);
      auVar187._8_8_ = 0;
      auVar187._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar3) * 2);
      auVar9 = vpunpcklqdq_avx(auVar188,auVar187);
      local_1c40 = auVar226._0_8_;
      uStack_1c38 = auVar226._8_8_;
      auVar60._16_8_ = local_1c40;
      auVar60._0_16_ = auVar9;
      auVar60._24_8_ = uStack_1c38;
      auVar59._16_8_ = uStack_dc10;
      auVar59._0_16_ = auVar225;
      auVar59._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar60,auVar59);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,7);
      uStack_3b0 = auVar8._0_8_;
      uStack_3a8 = auVar8._8_8_;
      auVar18 = vpsrlw_avx2(auVar20,ZEXT416(local_db20));
      auVar64._16_8_ = uStack_3b0;
      auVar64._0_16_ = auVar226;
      auVar64._24_8_ = uStack_3a8;
      auVar18 = vpsubusw_avx2(auVar64,auVar18);
      local_d600 = auVar17._0_8_;
      uStack_d5f8 = auVar17._8_8_;
      uStack_d5f0 = auVar17._16_8_;
      uStack_d5e8 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar18);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_6f40 = auVar20._0_8_;
      uStack_6f38 = auVar20._8_8_;
      uStack_6f30 = auVar20._16_8_;
      uStack_6f28 = auVar20._24_8_;
      auVar194._8_8_ = 0;
      auVar194._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x90) * 2);
      auVar193._8_8_ = 0;
      auVar193._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar3) * 2);
      auVar226 = vpunpcklqdq_avx(auVar194,auVar193);
      auVar192._8_8_ = 0;
      auVar192._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x1b0) * 2);
      auVar191._8_8_ = 0;
      auVar191._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x120) * 2);
      auVar13 = vpunpcklqdq_avx(auVar192,auVar191);
      local_1cb0 = auVar226._0_8_;
      uStack_1ca8 = auVar226._8_8_;
      auVar62._16_8_ = local_1cb0;
      auVar62._0_16_ = auVar13;
      auVar62._24_8_ = uStack_1ca8;
      auVar61._16_8_ = uStack_dc10;
      auVar61._0_16_ = auVar225;
      auVar61._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar62,auVar61);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_ECX & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_ECX & 0xffff,7);
      uStack_370 = auVar8._0_8_;
      uStack_368 = auVar8._8_8_;
      auVar18 = vpsrlw_avx2(auVar20,ZEXT416(local_db20));
      auVar63._16_8_ = uStack_370;
      auVar63._0_16_ = auVar226;
      auVar63._24_8_ = uStack_368;
      auVar18 = vpsubusw_avx2(auVar63,auVar18);
      local_d6e0 = auVar17._0_8_;
      uStack_d6d8 = auVar17._8_8_;
      uStack_d6d0 = auVar17._16_8_;
      uStack_d6c8 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar18);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_6f00 = auVar20._0_8_;
      uStack_6ef8 = auVar20._8_8_;
      uStack_6ef0 = auVar20._16_8_;
      uStack_6ee8 = auVar20._24_8_;
      uVar1 = (ushort)cdef_pri_taps[(int)uVar221][1];
      auVar226 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,2);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,3);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,4);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,5);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,6);
      auVar226 = vpinsrw_avx(auVar226,(uint)uVar1,7);
      auVar8 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,2);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,3);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,4);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,5);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,6);
      auVar8 = vpinsrw_avx(auVar8,(uint)uVar1,7);
      auVar227 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar226;
      uStack_70 = auVar227._0_8_;
      uStack_68 = auVar227._8_8_;
      auVar114._8_8_ = uStack_6f38 ^ uStack_d5f8;
      auVar114._0_8_ = local_6f40 ^ local_d600;
      auVar114._16_8_ = uStack_6f30 ^ uStack_d5f0;
      auVar114._24_8_ = uStack_6f28 ^ uStack_d5e8;
      auVar113._8_8_ = uStack_6ef8 ^ uStack_d6d8;
      auVar113._0_8_ = local_6f00 ^ local_d6e0;
      auVar113._16_8_ = uStack_6ef0 ^ uStack_d6d0;
      auVar113._24_8_ = uStack_6ee8 ^ uStack_d6c8;
      auVar20 = vpaddw_avx2(auVar114,auVar113);
      auVar122._16_8_ = uStack_70;
      auVar122._0_16_ = ZEXT116(0) * auVar226 + ZEXT116(1) * auVar8;
      auVar122._24_8_ = uStack_68;
      auVar20 = vpmullw_avx2(auVar122,auVar20);
      auVar16 = vpaddw_avx2(auVar16,auVar20);
      auVar215._16_8_ = local_1b60;
      auVar215._0_16_ = auVar229;
      auVar215._24_8_ = uStack_1b58;
      auVar216._16_8_ = local_1bd0;
      auVar216._0_16_ = auVar12;
      auVar216._24_8_ = uStack_1bc8;
      auVar20 = vpmaxub_avx2(auVar215,auVar216);
      auVar217._16_8_ = local_1c40;
      auVar217._0_16_ = auVar9;
      auVar217._24_8_ = uStack_1c38;
      auVar20 = vpmaxub_avx2(auVar20,auVar217);
      auVar218._16_8_ = local_1cb0;
      auVar218._0_16_ = auVar13;
      auVar218._24_8_ = uStack_1ca8;
      auVar20 = vpmaxub_avx2(auVar20,auVar218);
      auVar123._16_8_ = uStack_dc90;
      auVar123._0_16_ = auVar223;
      auVar123._24_8_ = uStack_dc88;
      auVar20 = vpand_avx2(auVar20,auVar123);
      auVar153._16_8_ = uStack_dc10;
      auVar153._0_16_ = auVar225;
      auVar153._24_8_ = uStack_dc08;
      auVar18 = vpmaxsw_avx2(auVar153,auVar20);
      auVar149._16_8_ = uStack_dc10;
      auVar149._0_16_ = auVar225;
      auVar149._24_8_ = uStack_dc08;
      auVar148._16_8_ = local_1b60;
      auVar148._0_16_ = auVar229;
      auVar148._24_8_ = uStack_1b58;
      auVar20 = vpminsw_avx2(auVar149,auVar148);
      auVar150._16_8_ = local_1bd0;
      auVar150._0_16_ = auVar12;
      auVar150._24_8_ = uStack_1bc8;
      auVar20 = vpminsw_avx2(auVar20,auVar150);
      auVar151._16_8_ = local_1c40;
      auVar151._0_16_ = auVar9;
      auVar151._24_8_ = uStack_1c38;
      auVar20 = vpminsw_avx2(auVar20,auVar151);
      auVar152._16_8_ = local_1cb0;
      auVar152._0_16_ = auVar13;
      auVar152._24_8_ = uStack_1ca8;
      auVar15 = vpminsw_avx2(auVar20,auVar152);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar4) * 2);
      auVar227._8_8_ = 0;
      auVar227._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar4) * 2);
      auVar226 = vpunpcklqdq_avx(auVar10,auVar227);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar4) * 2);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar4) * 2);
      auVar229 = vpunpcklqdq_avx(auVar13,auVar9);
      local_17e0 = auVar226._0_8_;
      uStack_17d8 = auVar226._8_8_;
      auVar17._16_8_ = local_17e0;
      auVar17._0_16_ = auVar229;
      auVar17._24_8_ = uStack_17d8;
      auVar20._16_8_ = uStack_dc10;
      auVar20._0_16_ = auVar225;
      auVar20._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar17,auVar20);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,7);
      uStack_630 = auVar8._0_8_;
      uStack_628 = auVar8._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_db24));
      auVar74._16_8_ = uStack_630;
      auVar74._0_16_ = auVar226;
      auVar74._24_8_ = uStack_628;
      auVar19 = vpsubusw_avx2(auVar74,auVar19);
      local_cd40 = auVar17._0_8_;
      uStack_cd38 = auVar17._8_8_;
      uStack_cd30 = auVar17._16_8_;
      uStack_cd28 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_71c0 = auVar20._0_8_;
      uStack_71b8 = auVar20._8_8_;
      uStack_71b0 = auVar20._16_8_;
      uStack_71a8 = auVar20._24_8_;
      auVar228._8_8_ = 0;
      auVar228._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x90) * 2);
      auVar224._8_8_ = 0;
      auVar224._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar4) * 2);
      auVar226 = vpunpcklqdq_avx(auVar228,auVar224);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x1b0) * 2);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x120) * 2);
      auVar12 = vpunpcklqdq_avx(auVar14,auVar11);
      local_1850 = auVar226._0_8_;
      uStack_1848 = auVar226._8_8_;
      auVar45._16_8_ = local_1850;
      auVar45._0_16_ = auVar12;
      auVar45._24_8_ = uStack_1848;
      auVar19._16_8_ = uStack_dc10;
      auVar19._0_16_ = auVar225;
      auVar19._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar45,auVar19);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,7);
      uStack_5f0 = auVar8._0_8_;
      uStack_5e8 = auVar8._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_db24));
      auVar73._16_8_ = uStack_5f0;
      auVar73._0_16_ = auVar226;
      auVar73._24_8_ = uStack_5e8;
      auVar19 = vpsubusw_avx2(auVar73,auVar19);
      local_ce20 = auVar17._0_8_;
      uStack_ce18 = auVar17._8_8_;
      uStack_ce10 = auVar17._16_8_;
      uStack_ce08 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7180 = auVar20._0_8_;
      uStack_7178 = auVar20._8_8_;
      uStack_7170 = auVar20._16_8_;
      uStack_7168 = auVar20._24_8_;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar6) * 2);
      auVar157._8_8_ = 0;
      auVar157._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar6) * 2);
      auVar226 = vpunpcklqdq_avx(auVar158,auVar157);
      auVar156._8_8_ = 0;
      auVar156._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar6) * 2);
      auVar155._8_8_ = 0;
      auVar155._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar6) * 2);
      auVar9 = vpunpcklqdq_avx(auVar156,auVar155);
      local_18c0 = auVar226._0_8_;
      uStack_18b8 = auVar226._8_8_;
      auVar47._16_8_ = local_18c0;
      auVar47._0_16_ = auVar9;
      auVar47._24_8_ = uStack_18b8;
      auVar46._16_8_ = uStack_dc10;
      auVar46._0_16_ = auVar225;
      auVar46._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar47,auVar46);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,7);
      uStack_5b0 = auVar8._0_8_;
      uStack_5a8 = auVar8._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_db24));
      auVar72._16_8_ = uStack_5b0;
      auVar72._0_16_ = auVar226;
      auVar72._24_8_ = uStack_5a8;
      auVar19 = vpsubusw_avx2(auVar72,auVar19);
      local_cf00 = auVar17._0_8_;
      uStack_cef8 = auVar17._8_8_;
      uStack_cef0 = auVar17._16_8_;
      uStack_cee8 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7140 = auVar20._0_8_;
      uStack_7138 = auVar20._8_8_;
      uStack_7130 = auVar20._16_8_;
      uStack_7128 = auVar20._24_8_;
      auVar162._8_8_ = 0;
      auVar162._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar6) + 0x90) * 2);
      auVar161._8_8_ = 0;
      auVar161._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar6) * 2);
      auVar226 = vpunpcklqdq_avx(auVar162,auVar161);
      auVar160._8_8_ = 0;
      auVar160._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar6) + 0x1b0) * 2);
      auVar159._8_8_ = 0;
      auVar159._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar6) + 0x120) * 2);
      auVar13 = vpunpcklqdq_avx(auVar160,auVar159);
      local_1930 = auVar226._0_8_;
      uStack_1928 = auVar226._8_8_;
      auVar49._16_8_ = local_1930;
      auVar49._0_16_ = auVar13;
      auVar49._24_8_ = uStack_1928;
      auVar48._16_8_ = uStack_dc10;
      auVar48._0_16_ = auVar225;
      auVar48._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar49,auVar48);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,7);
      uStack_570 = auVar8._0_8_;
      uStack_568 = auVar8._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_db24));
      auVar71._16_8_ = uStack_570;
      auVar71._0_16_ = auVar226;
      auVar71._24_8_ = uStack_568;
      auVar19 = vpsubusw_avx2(auVar71,auVar19);
      local_cfe0 = auVar17._0_8_;
      uStack_cfd8 = auVar17._8_8_;
      uStack_cfd0 = auVar17._16_8_;
      uStack_cfc8 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7100 = auVar20._0_8_;
      uStack_70f8 = auVar20._8_8_;
      uStack_70f0 = auVar20._16_8_;
      uStack_70e8 = auVar20._24_8_;
      auVar226 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar226 = vpinsrw_avx(auVar226,2,2);
      auVar226 = vpinsrw_avx(auVar226,2,3);
      auVar226 = vpinsrw_avx(auVar226,2,4);
      auVar226 = vpinsrw_avx(auVar226,2,5);
      auVar226 = vpinsrw_avx(auVar226,2,6);
      auVar226 = vpinsrw_avx(auVar226,2,7);
      auVar8 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar8 = vpinsrw_avx(auVar8,2,2);
      auVar8 = vpinsrw_avx(auVar8,2,3);
      auVar8 = vpinsrw_avx(auVar8,2,4);
      auVar8 = vpinsrw_avx(auVar8,2,5);
      auVar8 = vpinsrw_avx(auVar8,2,6);
      auVar8 = vpinsrw_avx(auVar8,2,7);
      uStack_130 = auVar8._0_8_;
      uStack_128 = auVar8._8_8_;
      auVar104._8_8_ = uStack_71b8 ^ uStack_cd38;
      auVar104._0_8_ = local_71c0 ^ local_cd40;
      auVar104._16_8_ = uStack_71b0 ^ uStack_cd30;
      auVar104._24_8_ = uStack_71a8 ^ uStack_cd28;
      auVar103._8_8_ = uStack_7178 ^ uStack_ce18;
      auVar103._0_8_ = local_7180 ^ local_ce20;
      auVar103._16_8_ = uStack_7170 ^ uStack_ce10;
      auVar103._24_8_ = uStack_7168 ^ uStack_ce08;
      auVar20 = vpaddw_avx2(auVar104,auVar103);
      auVar106._8_8_ = uStack_7138 ^ uStack_cef8;
      auVar106._0_8_ = local_7140 ^ local_cf00;
      auVar106._16_8_ = uStack_7130 ^ uStack_cef0;
      auVar106._24_8_ = uStack_7128 ^ uStack_cee8;
      auVar105._8_8_ = uStack_70f8 ^ uStack_cfd8;
      auVar105._0_8_ = local_7100 ^ local_cfe0;
      auVar105._16_8_ = uStack_70f0 ^ uStack_cfd0;
      auVar105._24_8_ = uStack_70e8 ^ uStack_cfc8;
      auVar17 = vpaddw_avx2(auVar106,auVar105);
      auVar20 = vpaddw_avx2(auVar20,auVar17);
      auVar119._16_8_ = uStack_130;
      auVar119._0_16_ = auVar226;
      auVar119._24_8_ = uStack_128;
      auVar20 = vpmullw_avx2(auVar119,auVar20);
      auVar16 = vpaddw_avx2(auVar16,auVar20);
      auVar166._8_8_ = 0;
      auVar166._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar5) * 2);
      auVar165._8_8_ = 0;
      auVar165._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar5) * 2);
      auVar226 = vpunpcklqdq_avx(auVar166,auVar165);
      auVar164._8_8_ = 0;
      auVar164._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar5) * 2);
      auVar163._8_8_ = 0;
      auVar163._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar5) * 2);
      auVar227 = vpunpcklqdq_avx(auVar164,auVar163);
      local_19a0 = auVar226._0_8_;
      uStack_1998 = auVar226._8_8_;
      auVar51._16_8_ = local_19a0;
      auVar51._0_16_ = auVar227;
      auVar51._24_8_ = uStack_1998;
      auVar50._16_8_ = uStack_dc10;
      auVar50._0_16_ = auVar225;
      auVar50._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar51,auVar50);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,7);
      uStack_530 = auVar8._0_8_;
      uStack_528 = auVar8._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_db24));
      auVar70._16_8_ = uStack_530;
      auVar70._0_16_ = auVar226;
      auVar70._24_8_ = uStack_528;
      auVar19 = vpsubusw_avx2(auVar70,auVar19);
      local_d0c0 = auVar17._0_8_;
      uStack_d0b8 = auVar17._8_8_;
      uStack_d0b0 = auVar17._16_8_;
      uStack_d0a8 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_70c0 = auVar20._0_8_;
      uStack_70b8 = auVar20._8_8_;
      uStack_70b0 = auVar20._16_8_;
      uStack_70a8 = auVar20._24_8_;
      auVar170._8_8_ = 0;
      auVar170._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar5) + 0x90) * 2);
      auVar169._8_8_ = 0;
      auVar169._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar5) * 2);
      auVar226 = vpunpcklqdq_avx(auVar170,auVar169);
      auVar168._8_8_ = 0;
      auVar168._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar5) + 0x1b0) * 2);
      auVar167._8_8_ = 0;
      auVar167._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar5) + 0x120) * 2);
      auVar10 = vpunpcklqdq_avx(auVar168,auVar167);
      local_1a10 = auVar226._0_8_;
      uStack_1a08 = auVar226._8_8_;
      auVar53._16_8_ = local_1a10;
      auVar53._0_16_ = auVar10;
      auVar53._24_8_ = uStack_1a08;
      auVar52._16_8_ = uStack_dc10;
      auVar52._0_16_ = auVar225;
      auVar52._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar53,auVar52);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,7);
      uStack_4f0 = auVar8._0_8_;
      uStack_4e8 = auVar8._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_db24));
      auVar69._16_8_ = uStack_4f0;
      auVar69._0_16_ = auVar226;
      auVar69._24_8_ = uStack_4e8;
      auVar19 = vpsubusw_avx2(auVar69,auVar19);
      local_d1a0 = auVar17._0_8_;
      uStack_d198 = auVar17._8_8_;
      uStack_d190 = auVar17._16_8_;
      uStack_d188 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7080 = auVar20._0_8_;
      uStack_7078 = auVar20._8_8_;
      uStack_7070 = auVar20._16_8_;
      uStack_7068 = auVar20._24_8_;
      auVar174._8_8_ = 0;
      auVar174._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar7) * 2);
      auVar173._8_8_ = 0;
      auVar173._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar7) * 2);
      auVar226 = vpunpcklqdq_avx(auVar174,auVar173);
      auVar172._8_8_ = 0;
      auVar172._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar7) * 2);
      auVar171._8_8_ = 0;
      auVar171._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar7) * 2);
      auVar11 = vpunpcklqdq_avx(auVar172,auVar171);
      local_1a80 = auVar226._0_8_;
      uStack_1a78 = auVar226._8_8_;
      auVar55._16_8_ = local_1a80;
      auVar55._0_16_ = auVar11;
      auVar55._24_8_ = uStack_1a78;
      auVar54._16_8_ = uStack_dc10;
      auVar54._0_16_ = auVar225;
      auVar54._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar55,auVar54);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,7);
      uStack_4b0 = auVar8._0_8_;
      uStack_4a8 = auVar8._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_db24));
      auVar68._16_8_ = uStack_4b0;
      auVar68._0_16_ = auVar226;
      auVar68._24_8_ = uStack_4a8;
      auVar19 = vpsubusw_avx2(auVar68,auVar19);
      local_d280 = auVar17._0_8_;
      uStack_d278 = auVar17._8_8_;
      uStack_d270 = auVar17._16_8_;
      uStack_d268 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7040 = auVar20._0_8_;
      uStack_7038 = auVar20._8_8_;
      uStack_7030 = auVar20._16_8_;
      uStack_7028 = auVar20._24_8_;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar7) + 0x90) * 2);
      auVar177._8_8_ = 0;
      auVar177._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar7) * 2);
      auVar226 = vpunpcklqdq_avx(auVar178,auVar177);
      auVar176._8_8_ = 0;
      auVar176._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar7) + 0x1b0) * 2);
      auVar175._8_8_ = 0;
      auVar175._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar7) + 0x120) * 2);
      auVar14 = vpunpcklqdq_avx(auVar176,auVar175);
      local_1af0 = auVar226._0_8_;
      uStack_1ae8 = auVar226._8_8_;
      auVar57._16_8_ = local_1af0;
      auVar57._0_16_ = auVar14;
      auVar57._24_8_ = uStack_1ae8;
      auVar56._16_8_ = uStack_dc10;
      auVar56._0_16_ = auVar225;
      auVar56._24_8_ = uStack_dc08;
      auVar20 = vpsubw_avx2(auVar57,auVar56);
      auVar17 = vpsraw_avx2(auVar20,ZEXT416(0xf));
      auVar20 = vpabsw_avx2(auVar20);
      auVar226 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,2);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,3);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,4);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,5);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,6);
      auVar226 = vpinsrw_avx(auVar226,in_R8D & 0xffff,7);
      auVar8 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,2);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,3);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,4);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,5);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,6);
      auVar8 = vpinsrw_avx(auVar8,in_R8D & 0xffff,7);
      uStack_470 = auVar8._0_8_;
      uStack_468 = auVar8._8_8_;
      auVar19 = vpsrlw_avx2(auVar20,ZEXT416(local_db24));
      auVar67._16_8_ = uStack_470;
      auVar67._0_16_ = auVar226;
      auVar67._24_8_ = uStack_468;
      auVar19 = vpsubusw_avx2(auVar67,auVar19);
      local_d360 = auVar17._0_8_;
      uStack_d358 = auVar17._8_8_;
      uStack_d350 = auVar17._16_8_;
      uStack_d348 = auVar17._24_8_;
      auVar20 = vpminsw_avx2(auVar20,auVar19);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      local_7000 = auVar20._0_8_;
      uStack_6ff8 = auVar20._8_8_;
      uStack_6ff0 = auVar20._16_8_;
      uStack_6fe8 = auVar20._24_8_;
      auVar226 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar226 = vpinsrw_avx(auVar226,1,2);
      auVar226 = vpinsrw_avx(auVar226,1,3);
      auVar226 = vpinsrw_avx(auVar226,1,4);
      auVar226 = vpinsrw_avx(auVar226,1,5);
      auVar226 = vpinsrw_avx(auVar226,1,6);
      auVar226 = vpinsrw_avx(auVar226,1,7);
      auVar8 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar8 = vpinsrw_avx(auVar8,1,2);
      auVar8 = vpinsrw_avx(auVar8,1,3);
      auVar8 = vpinsrw_avx(auVar8,1,4);
      auVar8 = vpinsrw_avx(auVar8,1,5);
      auVar8 = vpinsrw_avx(auVar8,1,6);
      auVar8 = vpinsrw_avx(auVar8,1,7);
      auVar224 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar226;
      uStack_f0 = auVar224._0_8_;
      uStack_e8 = auVar224._8_8_;
      auVar108._8_8_ = uStack_70b8 ^ uStack_d0b8;
      auVar108._0_8_ = local_70c0 ^ local_d0c0;
      auVar108._16_8_ = uStack_70b0 ^ uStack_d0b0;
      auVar108._24_8_ = uStack_70a8 ^ uStack_d0a8;
      auVar107._8_8_ = uStack_7078 ^ uStack_d198;
      auVar107._0_8_ = local_7080 ^ local_d1a0;
      auVar107._16_8_ = uStack_7070 ^ uStack_d190;
      auVar107._24_8_ = uStack_7068 ^ uStack_d188;
      auVar20 = vpaddw_avx2(auVar108,auVar107);
      auVar110._8_8_ = uStack_7038 ^ uStack_d278;
      auVar110._0_8_ = local_7040 ^ local_d280;
      auVar110._16_8_ = uStack_7030 ^ uStack_d270;
      auVar110._24_8_ = uStack_7028 ^ uStack_d268;
      auVar109._8_8_ = uStack_6ff8 ^ uStack_d358;
      auVar109._0_8_ = local_7000 ^ local_d360;
      auVar109._16_8_ = uStack_6ff0 ^ uStack_d350;
      auVar109._24_8_ = uStack_6fe8 ^ uStack_d348;
      auVar17 = vpaddw_avx2(auVar110,auVar109);
      auVar20 = vpaddw_avx2(auVar20,auVar17);
      auVar120._16_8_ = uStack_f0;
      auVar120._0_16_ = ZEXT116(0) * auVar226 + ZEXT116(1) * auVar8;
      auVar120._24_8_ = uStack_e8;
      auVar20 = vpmullw_avx2(auVar120,auVar20);
      auVar20 = vpaddw_avx2(auVar16,auVar20);
      auVar207._16_8_ = local_17e0;
      auVar207._0_16_ = auVar229;
      auVar207._24_8_ = uStack_17d8;
      auVar208._16_8_ = local_1850;
      auVar208._0_16_ = auVar12;
      auVar208._24_8_ = uStack_1848;
      auVar16 = vpmaxub_avx2(auVar207,auVar208);
      auVar209._16_8_ = local_18c0;
      auVar209._0_16_ = auVar9;
      auVar209._24_8_ = uStack_18b8;
      auVar16 = vpmaxub_avx2(auVar16,auVar209);
      auVar210._16_8_ = local_1930;
      auVar210._0_16_ = auVar13;
      auVar210._24_8_ = uStack_1928;
      auVar16 = vpmaxub_avx2(auVar16,auVar210);
      auVar211._16_8_ = local_19a0;
      auVar211._0_16_ = auVar227;
      auVar211._24_8_ = uStack_1998;
      auVar16 = vpmaxub_avx2(auVar16,auVar211);
      auVar212._16_8_ = local_1a10;
      auVar212._0_16_ = auVar10;
      auVar212._24_8_ = uStack_1a08;
      auVar16 = vpmaxub_avx2(auVar16,auVar212);
      auVar213._16_8_ = local_1a80;
      auVar213._0_16_ = auVar11;
      auVar213._24_8_ = uStack_1a78;
      auVar16 = vpmaxub_avx2(auVar16,auVar213);
      auVar214._16_8_ = local_1af0;
      auVar214._0_16_ = auVar14;
      auVar214._24_8_ = uStack_1ae8;
      auVar16 = vpmaxub_avx2(auVar16,auVar214);
      auVar125._16_8_ = uStack_dc90;
      auVar125._0_16_ = auVar223;
      auVar125._24_8_ = uStack_dc88;
      auVar16 = vpand_avx2(auVar16,auVar125);
      auVar17 = vpmaxsw_avx2(auVar18,auVar16);
      auVar140._16_8_ = local_17e0;
      auVar140._0_16_ = auVar229;
      auVar140._24_8_ = uStack_17d8;
      auVar16 = vpminsw_avx2(auVar15,auVar140);
      auVar141._16_8_ = local_1850;
      auVar141._0_16_ = auVar12;
      auVar141._24_8_ = uStack_1848;
      auVar16 = vpminsw_avx2(auVar16,auVar141);
      auVar142._16_8_ = local_18c0;
      auVar142._0_16_ = auVar9;
      auVar142._24_8_ = uStack_18b8;
      auVar16 = vpminsw_avx2(auVar16,auVar142);
      auVar143._16_8_ = local_1930;
      auVar143._0_16_ = auVar13;
      auVar143._24_8_ = uStack_1928;
      auVar16 = vpminsw_avx2(auVar16,auVar143);
      auVar144._16_8_ = local_19a0;
      auVar144._0_16_ = auVar227;
      auVar144._24_8_ = uStack_1998;
      auVar16 = vpminsw_avx2(auVar16,auVar144);
      auVar145._16_8_ = local_1a10;
      auVar145._0_16_ = auVar10;
      auVar145._24_8_ = uStack_1a08;
      auVar16 = vpminsw_avx2(auVar16,auVar145);
      auVar146._16_8_ = local_1a80;
      auVar146._0_16_ = auVar11;
      auVar146._24_8_ = uStack_1a78;
      auVar16 = vpminsw_avx2(auVar16,auVar146);
      auVar147._16_8_ = local_1af0;
      auVar147._0_16_ = auVar14;
      auVar147._24_8_ = uStack_1ae8;
      auVar18 = vpminsw_avx2(auVar16,auVar147);
      uStack_9038 = SUB328(ZEXT832(0),4);
      auVar16 = vpcmpgtw_avx2(ZEXT832(uStack_9038) << 0x40,auVar20);
      auVar20 = vpaddw_avx2(auVar20,auVar16);
      auVar226 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar226 = vpinsrw_avx(auVar226,8,2);
      auVar226 = vpinsrw_avx(auVar226,8,3);
      auVar226 = vpinsrw_avx(auVar226,8,4);
      auVar226 = vpinsrw_avx(auVar226,8,5);
      auVar226 = vpinsrw_avx(auVar226,8,6);
      auVar226 = vpinsrw_avx(auVar226,8,7);
      auVar8 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar8 = vpinsrw_avx(auVar8,8,2);
      auVar8 = vpinsrw_avx(auVar8,8,3);
      auVar8 = vpinsrw_avx(auVar8,8,4);
      auVar8 = vpinsrw_avx(auVar8,8,5);
      auVar8 = vpinsrw_avx(auVar8,8,6);
      auVar8 = vpinsrw_avx(auVar8,8,7);
      auVar229 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar226;
      uStack_170 = auVar229._0_8_;
      uStack_168 = auVar229._8_8_;
      auVar101._16_8_ = uStack_170;
      auVar101._0_16_ = ZEXT116(0) * auVar226 + ZEXT116(1) * auVar8;
      auVar101._24_8_ = uStack_168;
      auVar20 = vpaddw_avx2(auVar20,auVar101);
      auVar20 = vpsraw_avx2(auVar20,ZEXT416(4));
      auVar102._16_8_ = uStack_dc10;
      auVar102._0_16_ = auVar225;
      auVar102._24_8_ = uStack_dc08;
      auVar20 = vpaddw_avx2(auVar102,auVar20);
      auVar20 = vpmaxsw_avx2(auVar20,auVar18);
      auVar20 = vpminsw_avx2(auVar20,auVar17);
      auVar20 = vpackuswb_avx2(auVar20,auVar20);
      auVar20 = vpermq_avx2(auVar20,0xd8);
      auVar8 = auVar20._0_16_;
      auVar226 = vpsrldq_avx(auVar8,8);
      auVar226 = vpsrldq_avx(auVar226,4);
      local_1040 = auVar226._0_4_;
      *(undefined4 *)(in_RDI + local_dccc * in_ESI) = local_1040;
      auVar226 = vpsrldq_avx(auVar8,8);
      local_fe0 = auVar226._0_4_;
      *(undefined4 *)(in_RDI + (local_dccc + 1) * in_ESI) = local_fe0;
      uStack_1d18 = SUB168(ZEXT816(0),4);
      auVar225._8_8_ = 0;
      auVar225._0_8_ = uStack_1d18;
      auVar226 = vpunpcklqdq_avx(auVar8,auVar225 << 0x40);
      auVar226 = vpsrldq_avx(auVar226,4);
      local_1070 = auVar226._0_4_;
      *(undefined4 *)(in_RDI + (local_dccc + 2) * in_ESI) = local_1070;
      auVar220._8_8_ = 0;
      auVar220._0_8_ = uStack_1d18;
      auVar226 = vpunpcklqdq_avx(auVar8,auVar220 << 0x40);
      local_1010 = auVar226._0_4_;
      *(undefined4 *)(in_RDI + (local_dccc + 3) * in_ESI) = local_1010;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_0)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  }
}